

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::write_key_and_bool(t_json_generator *this,string *key,bool val)

{
  ostream *poVar1;
  t_json_generator *this_00;
  char *pcVar2;
  string sStack_48;
  
  write_comma_if_needed(this);
  this_00 = (t_json_generator *)&this->f_json_;
  poVar1 = t_generator::indent(&this->super_t_generator,(ostream *)this_00);
  json_str(&sStack_48,this_00,key);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = "false";
  if (val) {
    pcVar2 = "true";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::string::~string((string *)&sStack_48);
  indicate_comma_needed(this);
  return;
}

Assistant:

void t_json_generator::write_key_and_bool(string key, bool val) {
  write_comma_if_needed();
  indent(f_json_) << json_str(key) << ": " << (val ? "true" : "false");
  indicate_comma_needed();
}